

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingSetupTruthTables(uint (*uTruths) [2])

{
  int local_18;
  uint local_14;
  int v;
  int m;
  uint (*uTruths_local) [2];
  
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
      if ((local_14 & 1 << ((byte)local_18 & 0x1f)) != 0) {
        uTruths[local_18][0] = 1 << ((byte)local_14 & 0x1f) | uTruths[local_18][0];
      }
    }
  }
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    uTruths[local_18][1] = uTruths[local_18][0];
  }
  uTruths[5][0] = 0;
  uTruths[5][1] = 0xffffffff;
  return;
}

Assistant:

void Map_MappingSetupTruthTables( unsigned uTruths[][2] )
{
    int m, v;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
                uTruths[v][0] |= (1 << m);
    // make adjustments for the case of 6 variables
    for ( v = 0; v < 5; v++ )
        uTruths[v][1] = uTruths[v][0];
    uTruths[5][0] = 0;
    uTruths[5][1] = MAP_FULL;
}